

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

void __thiscall cmFileCopier::NotBeforeMatch(cmFileCopier *this,string *arg)

{
  cmCommand *this_00;
  ostream *poVar1;
  ostringstream e;
  string local_1b0;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"option ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(arg->_M_dataplus)._M_p,arg->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," may not appear before PATTERN or REGEX.",0x28);
  this_00 = &this->FileCommand->super_cmCommand;
  std::__cxx11::stringbuf::str();
  cmCommand::SetError(this_00,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  this->Doing = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void NotBeforeMatch(std::string const& arg)
    {
    std::ostringstream e;
    e << "option " << arg << " may not appear before PATTERN or REGEX.";
    this->FileCommand->SetError(e.str());
    this->Doing = DoingError;
    }